

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O1

void mdct_forward(mdct_lookup *init,float *in,float *out)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  float *pfVar12;
  long lVar13;
  long lVar14;
  int points;
  uint uVar15;
  ulong uVar16;
  float *pfVar17;
  float *pfVar18;
  uint uVar19;
  float *pfVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined8 uStack_60;
  float fStack_58;
  float fStack_54;
  undefined8 local_50;
  float *local_48;
  int local_3c;
  long local_38;
  
  iVar8 = init->n;
  local_50 = (long)iVar8;
  points = iVar8 >> 1;
  local_3c = iVar8 >> 2;
  uVar19 = iVar8 >> 3;
  lVar10 = -(local_50 * 4 + 0xfU & 0xfffffffffffffff0);
  lVar11 = lVar10 + -0x58;
  lVar22 = (long)points;
  lVar23 = (long)local_3c;
  pfVar12 = in + lVar22 + lVar23;
  pfVar17 = init->trig;
  local_48 = in;
  if ((int)uVar19 < 1) {
    uVar16 = 0;
  }
  else {
    pfVar12 = pfVar12 + 1;
    local_38 = CONCAT44(local_38._4_4_,uVar19);
    lVar13 = (long)&fStack_54 + lVar10;
    pfVar20 = in + lVar23 + 1;
    pfVar18 = in + lVar23;
    uVar16 = 0;
    do {
      fVar24 = pfVar18[lVar22 + -4];
      fVar25 = pfVar18[lVar22 + -2];
      fVar5 = pfVar20[lVar22];
      fVar6 = pfVar12[2];
      *(float *)(lVar13 + -4 + lVar22 * 4) =
           pfVar17[lVar22 + -1] * (fVar24 + fVar6) + pfVar17[lVar22 + -2] * (fVar25 + fVar5);
      *(float *)(lVar13 + lVar22 * 4) =
           (fVar24 + fVar6) * pfVar17[lVar22 + -2] - (fVar25 + fVar5) * pfVar17[lVar22 + -1];
      pfVar12 = pfVar12 + 4;
      uVar16 = uVar16 + 2;
      lVar13 = lVar13 + 8;
      pfVar17 = pfVar17 + -2;
      pfVar20 = pfVar20 + 4;
      pfVar18 = pfVar18 + -4;
    } while (uVar16 < uVar19);
    pfVar12 = pfVar18 + lVar22;
    uVar19 = (uint)local_38;
  }
  pfVar20 = local_48;
  pfVar17 = pfVar17 + lVar22;
  pfVar18 = local_48 + 1;
  uVar15 = (uint)uVar16;
  if ((int)uVar15 < (int)(points - uVar19)) {
    lVar13 = (uVar16 & 0xffffffff) * 4 + lVar22 * 4 + lVar11;
    lVar14 = 0;
    lVar21 = 0;
    local_38 = lVar23;
    do {
      fVar25 = *(float *)((long)pfVar12 + lVar14 + -8) - pfVar18[lVar21 * 2];
      fVar24 = *(float *)((long)pfVar12 + lVar14 + -0x10) - pfVar20[lVar21 * 2 + 3];
      *(float *)((long)&fStack_58 + lVar21 * 4 + lVar13 + 0x58) =
           pfVar17[-1] * fVar24 + pfVar17[-2] * fVar25;
      pfVar1 = pfVar17 + -1;
      pfVar2 = pfVar17 + -2;
      pfVar17 = pfVar17 + -2;
      *(float *)((long)&fStack_54 + lVar21 * 4 + lVar13 + 0x58) =
           fVar24 * *pfVar2 - fVar25 * *pfVar1;
      lVar23 = (uVar16 & 0xffffffff) + lVar21;
      lVar21 = lVar21 + 2;
      lVar14 = lVar14 + -0x10;
    } while (lVar23 + 2 < (long)(int)(points - uVar19));
    uVar15 = uVar15 + (int)lVar21;
    pfVar18 = (float *)((long)pfVar18 - lVar14);
    lVar23 = local_38;
  }
  pfVar12 = local_48;
  lVar13 = local_50;
  if ((int)uVar15 < points) {
    uVar16 = (ulong)uVar15;
    lVar14 = lVar22 * 4 + lVar11;
    lVar21 = -2;
    do {
      fVar24 = -pfVar12[lVar13 + lVar21] - *pfVar18;
      fVar25 = -pfVar12[lVar13 + lVar21 + -2] - pfVar18[2];
      *(float *)((long)&fStack_58 + uVar16 * 4 + lVar14 + 0x58) =
           *(float *)((long)pfVar17 + lVar21 * 2) * fVar25 +
           *(float *)((long)pfVar17 + lVar21 * 2 + -4) * fVar24;
      *(float *)((long)&fStack_54 + uVar16 * 4 + lVar14 + 0x58) =
           fVar25 * *(float *)((long)pfVar17 + lVar21 * 2 + -4) -
           fVar24 * *(float *)((long)pfVar17 + lVar21 * 2);
      pfVar18 = pfVar18 + 4;
      uVar16 = uVar16 + 2;
      lVar21 = lVar21 + -4;
    } while ((long)uVar16 < lVar22);
  }
  *(undefined8 *)((long)&uStack_60 + lVar10) = 0x1dbb78;
  mdct_butterflies(init,(float *)((long)&fStack_58 + lVar22 * 4 + lVar11 + 0x58),points);
  iVar8 = init->n;
  pfVar12 = init->trig;
  piVar9 = init->bitrev;
  uVar3 = (long)&fStack_58 + (long)(iVar8 >> 1) * 4 + lVar11 + 0x58;
  lVar13 = 0;
  uVar16 = uVar3;
  do {
    lVar14 = (long)*(int *)((long)piVar9 + lVar13 + 4);
    fVar24 = *(float *)(uVar3 + (long)*(int *)((long)piVar9 + lVar13) * 4);
    fVar25 = *(float *)(uVar3 + 4 + (long)*(int *)((long)piVar9 + lVar13) * 4);
    fVar5 = *(float *)(uVar3 + lVar14 * 4);
    fVar6 = *(float *)(uVar3 + 4 + lVar14 * 4);
    fVar28 = fVar25 - fVar6;
    fVar26 = fVar24 + fVar5;
    fVar27 = *(float *)((long)pfVar12 + lVar13 + (long)iVar8 * 4);
    fVar7 = *(float *)((long)pfVar12 + lVar13 + (long)iVar8 * 4 + 4);
    fVar29 = fVar26 * fVar27 + fVar28 * fVar7;
    fVar27 = fVar26 * fVar7 - fVar28 * fVar27;
    fVar25 = (fVar25 + fVar6) * 0.5;
    fVar24 = (fVar24 - fVar5) * 0.5;
    uVar4 = (long)&local_48 + lVar13 + lVar10;
    *(float *)(uVar4 - 0x10) = fVar25 + fVar29;
    *(float *)(uVar16 - 8) = fVar25 - fVar29;
    *(float *)(uVar4 - 0xc) = fVar24 + fVar27;
    *(float *)(uVar16 - 4) = fVar27 - fVar24;
    lVar14 = (long)*(int *)((long)piVar9 + lVar13 + 8);
    lVar21 = (long)*(int *)((long)piVar9 + lVar13 + 0xc);
    fVar24 = *(float *)(uVar3 + lVar14 * 4);
    fVar25 = *(float *)(uVar3 + 4 + lVar14 * 4);
    fVar5 = *(float *)(uVar3 + lVar21 * 4);
    fVar6 = *(float *)(uVar3 + 4 + lVar21 * 4);
    fVar28 = fVar25 - fVar6;
    fVar26 = fVar24 + fVar5;
    fVar27 = *(float *)((long)pfVar12 + lVar13 + (long)iVar8 * 4 + 8);
    fVar7 = *(float *)((long)pfVar12 + lVar13 + (long)iVar8 * 4 + 0xc);
    fVar29 = fVar26 * fVar27 + fVar28 * fVar7;
    fVar27 = fVar26 * fVar7 - fVar28 * fVar27;
    fVar25 = (fVar25 + fVar6) * 0.5;
    fVar24 = (fVar24 - fVar5) * 0.5;
    *(float *)(uVar4 - 8) = fVar25 + fVar29;
    *(float *)(uVar16 - 0x10) = fVar25 - fVar29;
    *(float *)(uVar4 - 4) = fVar24 + fVar27;
    *(float *)(uVar16 - 0xc) = fVar27 - fVar24;
    uVar16 = uVar16 - 0x10;
    lVar13 = lVar13 + 0x10;
  } while (uVar4 < uVar16);
  if (0 < local_3c) {
    lVar14 = 0;
    lVar13 = lVar22;
    do {
      lVar13 = lVar13 + -1;
      fVar24 = *(float *)((long)&fStack_58 + lVar14 * 8 + lVar11 + 0x58);
      fVar25 = *(float *)((long)&fStack_54 + lVar14 * 8 + lVar10);
      out[lVar14] = (pfVar12[lVar22 + lVar14 * 2] * fVar24 +
                    pfVar12[lVar22 + lVar14 * 2 + 1] * fVar25) * init->scale;
      out[lVar13] = (fVar24 * pfVar12[lVar22 + lVar14 * 2 + 1] -
                    fVar25 * pfVar12[lVar22 + lVar14 * 2]) * init->scale;
      lVar14 = lVar14 + 1;
    } while (lVar23 != lVar14);
  }
  return;
}

Assistant:

void mdct_forward(mdct_lookup *init, DATA_TYPE *in, DATA_TYPE *out){
  int n=init->n;
  int n2=n>>1;
  int n4=n>>2;
  int n8=n>>3;
  DATA_TYPE *w=alloca(n*sizeof(*w)); /* forward needs working space */
  DATA_TYPE *w2=w+n2;

  /* rotate */

  /* window + rotate + step 1 */

  REG_TYPE r0;
  REG_TYPE r1;
  DATA_TYPE *x0=in+n2+n4;
  DATA_TYPE *x1=x0+1;
  DATA_TYPE *T=init->trig+n2;

  int i=0;

  for(i=0;i<n8;i+=2){
    x0 -=4;
    T-=2;
    r0= x0[2] + x1[0];
    r1= x0[0] + x1[2];
    w2[i]=   MULT_NORM(r1*T[1] + r0*T[0]);
    w2[i+1]= MULT_NORM(r1*T[0] - r0*T[1]);
    x1 +=4;
  }

  x1=in+1;

  for(;i<n2-n8;i+=2){
    T-=2;
    x0 -=4;
    r0= x0[2] - x1[0];
    r1= x0[0] - x1[2];
    w2[i]=   MULT_NORM(r1*T[1] + r0*T[0]);
    w2[i+1]= MULT_NORM(r1*T[0] - r0*T[1]);
    x1 +=4;
  }

  x0=in+n;

  for(;i<n2;i+=2){
    T-=2;
    x0 -=4;
    r0= -x0[2] - x1[0];
    r1= -x0[0] - x1[2];
    w2[i]=   MULT_NORM(r1*T[1] + r0*T[0]);
    w2[i+1]= MULT_NORM(r1*T[0] - r0*T[1]);
    x1 +=4;
  }


  mdct_butterflies(init,w+n2,n2);
  mdct_bitreverse(init,w);

  /* roatate + window */

  T=init->trig+n2;
  x0=out+n2;

  for(i=0;i<n4;i++){
    x0--;
    out[i] =MULT_NORM((w[0]*T[0]+w[1]*T[1])*init->scale);
    x0[0]  =MULT_NORM((w[0]*T[1]-w[1]*T[0])*init->scale);
    w+=2;
    T+=2;
  }
}